

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O0

char * mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
       GetTypeName(void)

{
  int iVar1;
  char *pcVar2;
  allocator<char> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  allocator<char> local_41;
  string local_40 [16];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  if (IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>::
      GetTypeName()::name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                                 ::GetTypeName()::name_abi_cxx11_);
    if (iVar1 != 0) {
      __rhs = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::GetTypeName();
      std::operator+(in_stack_ffffffffffffffa8,(char *)__rhs);
      std::operator+(in_stack_ffffffffffffffa8,(char)((ulong)__rhs >> 0x38));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffe0);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator(&local_41);
      __cxa_atexit(std::__cxx11::string::~string,
                   &IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                    ::GetTypeName()::name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                           ::GetTypeName()::name_abi_cxx11_);
    }
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

static const char* GetTypeName() {
    static std::string name
        { std::string("IndicatorConstraint[") + Con::GetTypeName() + ']' };
    return name.c_str();
  }